

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O3

DdNode * Cudd_bddLICompaction(DdManager *dd,DdNode *f,DdNode *c)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddLICompaction(dd,f,c);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddLICompaction(
  DdManager * dd /* manager */,
  DdNode * f /* function to be minimized */,
  DdNode * c /* constraint (care set) */)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddLICompaction(dd,f,c);
    } while (dd->reordered == 1);
    return(res);

}